

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_parse_function_check_names(JSParseState *s,JSFunctionDef *fd,JSAtom func_name)

{
  JSAtom *pJVar1;
  ushort uVar2;
  JSAtom JVar3;
  int iVar4;
  ulong uVar5;
  char *fmt;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if ((fd->js_mode & 1) == 0) {
    if ((((fd->has_simple_parameter_list != 0) &&
         (uVar2 = *(ushort *)&fd->field_0x84, uVar2 != 0x602)) && ((char)(uVar2 >> 8) != '\x06')) &&
       (uVar2 >> 8 != 3)) {
      return 0;
    }
LAB_00149e53:
    iVar4 = 0;
    uVar5 = (ulong)(uint)fd->arg_count;
    if (fd->arg_count < 1) {
      uVar5 = 0;
    }
    lVar7 = 0x10;
    fmt = "duplicate argument names not allowed in this context";
    for (uVar8 = 0; uVar8 != uVar5; uVar8 = uVar8 + 1) {
      JVar3 = fd->args[uVar8].var_name;
      if (JVar3 != 0) {
        lVar6 = 0;
        while (lVar7 != lVar6 + 0x10) {
          pJVar1 = (JSAtom *)((long)&fd->args->var_name + lVar6);
          lVar6 = lVar6 + 0x10;
          if (*pJVar1 == JVar3) goto LAB_00149f43;
        }
        uVar9 = (ulong)(uint)fd->var_count;
        if (fd->var_count < 1) {
          uVar9 = 0;
        }
        for (lVar6 = 0; uVar9 * 0x10 != lVar6; lVar6 = lVar6 + 0x10) {
          if ((*(JSAtom *)((long)&fd->vars->var_name + lVar6) == JVar3) &&
             (*(int *)((long)&fd->vars->scope_level + lVar6) == 0)) goto LAB_00149f43;
        }
      }
      lVar7 = lVar7 + 0x10;
    }
  }
  else {
    if ((fd->has_simple_parameter_list == 0) && (fd->has_use_strict != 0)) {
      fmt = "\"use strict\" not allowed in function with default or destructuring parameter";
    }
    else {
      fmt = "invalid function name in strict code";
      if ((func_name != 0x3a) && (func_name != 0x4d)) {
        uVar8 = 0;
        uVar5 = (ulong)(uint)fd->arg_count;
        if (fd->arg_count < 1) {
          uVar5 = uVar8;
        }
        for (; uVar5 * 0x10 != uVar8; uVar8 = uVar8 + 0x10) {
          iVar4 = *(int *)((long)&fd->args->var_name + uVar8);
          if ((iVar4 == 0x3a) || (iVar4 == 0x4d)) {
            fmt = "invalid argument name in strict code";
            goto LAB_00149f43;
          }
        }
        goto LAB_00149e53;
      }
    }
LAB_00149f43:
    js_parse_error(s,fmt);
    iVar4 = -1;
  }
  return iVar4;
}

Assistant:

static int js_parse_function_check_names(JSParseState *s, JSFunctionDef *fd,
                                         JSAtom func_name)
{
    JSAtom name;
    int i, idx;

    if (fd->js_mode & JS_MODE_STRICT) {
        if (!fd->has_simple_parameter_list && fd->has_use_strict) {
            return js_parse_error(s, "\"use strict\" not allowed in function with default or destructuring parameter");
        }
        if (func_name == JS_ATOM_eval || func_name == JS_ATOM_arguments) {
            return js_parse_error(s, "invalid function name in strict code");
        }
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;

            if (name == JS_ATOM_eval || name == JS_ATOM_arguments) {
                return js_parse_error(s, "invalid argument name in strict code");
            }
        }
    }
    /* check async_generator case */
    if ((fd->js_mode & JS_MODE_STRICT)
    ||  !fd->has_simple_parameter_list
    ||  (fd->func_type == JS_PARSE_FUNC_METHOD && fd->func_kind == JS_FUNC_ASYNC)
    ||  fd->func_type == JS_PARSE_FUNC_ARROW
    ||  fd->func_type == JS_PARSE_FUNC_METHOD) {
        for (idx = 0; idx < fd->arg_count; idx++) {
            name = fd->args[idx].var_name;
            if (name != JS_ATOM_NULL) {
                for (i = 0; i < idx; i++) {
                    if (fd->args[i].var_name == name)
                        goto duplicate;
                }
                /* Check if argument name duplicates a destructuring parameter */
                /* XXX: should have a flag for such variables */
                for (i = 0; i < fd->var_count; i++) {
                    if (fd->vars[i].var_name == name &&
                        fd->vars[i].scope_level == 0)
                        goto duplicate;
                }
            }
        }
    }
    return 0;

duplicate:
    return js_parse_error(s, "duplicate argument names not allowed in this context");
}